

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback,void *user_data)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  
  pIVar3 = GImGui;
  while( true ) {
    if ((pIVar3->CurrentWindowStack).Size < 1) {
      return;
    }
    ErrorCheckEndWindowRecover(log_callback,user_data);
    iVar1 = (pIVar3->CurrentWindowStack).Size;
    if (iVar1 == 1) break;
    pIVar2 = pIVar3->CurrentWindow;
    if ((pIVar2->Flags & 0x1000000) == 0) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing End() for \'%s\'",pIVar2->Name);
      }
      End();
    }
    else {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndChild() for \'%s\'",pIVar2->Name);
      }
      EndChild();
    }
    if (iVar1 == 1) {
      return;
    }
  }
  return;
}

Assistant:

void    ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback, void* user_data)
{
    // PVS-Studio V1044 is "Loop break conditions do not depend on the number of iterations"
    ImGuiContext& g = *GImGui;
    while (g.CurrentWindowStack.Size > 0) //-V1044
    {
        ErrorCheckEndWindowRecover(log_callback, user_data);
        ImGuiWindow* window = g.CurrentWindow;
        if (g.CurrentWindowStack.Size == 1)
        {
            IM_ASSERT(window->IsFallbackWindow);
            break;
        }
        IM_ASSERT(window == g.CurrentWindow);
        if (window->Flags & ImGuiWindowFlags_ChildWindow)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndChild() for '%s'", window->Name);
            EndChild();
        }
        else
        {
            if (log_callback) log_callback(user_data, "Recovered from missing End() for '%s'", window->Name);
            End();
        }
    }
}